

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRequest.cpp
# Opt level: O2

int __thiscall HttpRequest::buildFirstLine(HttpRequest *this)

{
  string *psVar1;
  URI *this_00;
  string *psVar2;
  
  psVar1 = &(this->super_HttpHeader).super_HttpHeaderBase.mHeaderStr;
  std::__cxx11::string::assign((char *)psVar1);
  std::__cxx11::string::append((char *)psVar1);
  this_00 = &this->mUri;
  URI::getPath_abi_cxx11_(this_00);
  std::__cxx11::string::append((string *)psVar1);
  psVar2 = URI::getQuery_abi_cxx11_(this_00);
  if (psVar2->_M_string_length != 0) {
    std::__cxx11::string::append((char *)psVar1);
    URI::getQuery_abi_cxx11_(this_00);
    std::__cxx11::string::append((string *)psVar1);
  }
  std::__cxx11::string::append((char *)psVar1);
  return (int)(this->super_HttpHeader).super_HttpHeaderBase.mHeaderStr._M_string_length;
}

Assistant:

int HttpRequest::buildFirstLine() const
{
	mHeaderStr = gMethodTypeList[ mMethod ]; 

	mHeaderStr += " ";
	mHeaderStr += mUri.getPath();

	if (not mUri.getQuery().empty())
	{
		mHeaderStr += "?";
		mHeaderStr += mUri.getQuery();
	}

	mHeaderStr += " HTTP/1.1\r\n";

	return mHeaderStr.size();
}